

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O0

void timCallback(Timer *tim,Simulator *sim,int64_t *t,bool ismain)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  int *local_50;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *local_48;
  value_type local_40;
  int64_t vt;
  int *rstep;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *vts;
  int64_t *piStack_20;
  bool ismain_local;
  int64_t *t_local;
  Simulator *sim_local;
  Timer *tim_local;
  
  if (ismain) {
    local_48 = &vt1s;
  }
  else {
    local_48 = &vt2s;
  }
  rstep = (int *)local_48;
  if (ismain) {
    local_50 = &r1step;
  }
  else {
    local_50 = &r2step;
  }
  vt = (int64_t)local_50;
  iVar1 = *local_50;
  *local_50 = iVar1 + -1;
  vts._7_1_ = ismain;
  piStack_20 = t;
  t_local = (int64_t *)sim;
  sim_local = (Simulator *)tim;
  if (iVar1 + -1 < 1) {
    brown::Timer::stop(tim);
    *piStack_20 = 0;
    std::stack<long,_std::deque<long,_std::allocator<long>_>_>::empty
              ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)rstep);
  }
  else {
    local_40 = 0;
    sVar3 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::size(local_48);
    if (sVar3 < (ulong)(long)*(int *)vt) {
      bVar2 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::empty
                        ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)rstep);
      if ((bVar2) ||
         (pvVar4 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::top
                             ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)rstep),
         (long)*(int *)((long)t_local + 0x34) < *pvVar4)) {
        local_40 = linearSpeedCurve((Simulator *)t_local,*piStack_20);
        if (local_40 < *(int *)((long)t_local + 0x34)) {
          local_40 = (value_type)*(int *)((long)t_local + 0x34);
        }
        std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push
                  ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)rstep,&local_40);
      }
      else {
        local_40 = (value_type)*(int *)((long)t_local + 0x34);
      }
    }
    else {
      pvVar4 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::top
                         ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)rstep);
      local_40 = *pvVar4;
      std::stack<long,_std::deque<long,_std::allocator<long>_>_>::pop
                ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)rstep);
    }
    if ((vts._7_1_ & 1) == 0) {
      local_40 = (value_type)((float)local_40 * tg);
    }
    brown::Timer::setPeriod((Timer *)sim_local,(uint32_t)local_40);
    *piStack_20 = local_40 + *piStack_20;
  }
  return;
}

Assistant:

static void timCallback(brown::Timer& tim, brown::Simulator& sim,
                        std::int64_t& t, bool ismain) {
    std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;
    int& rstep = ismain? r1step : r2step;

    if (--rstep <= 0) {
        tim.stop();
        t = 0; vts.empty();
        return;
    }

    // set next speed interval
    std::int64_t vt = 0;
    if (vts.size() >= rstep) { // decelerate
        vt = vts.top();
        vts.pop();
    } else if (vts.empty() || (vts.top() > sim.MINT)) { // accelerate
        vt = linearSpeedCurve(sim, t);
        if (vt < sim.MINT) { // speeding
            vt = sim.MINT;
        }
        vts.push(vt);
    } else { // hold
        vt = sim.MINT;
    }

    // adjust speed on secondary axis
    if (!ismain) {
        vt *= tg;
    }
    tim.setPeriod(vt);
    t += vt;
}